

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O2

Data2D<int> * __thiscall
TasGrid::GridWavelet::buildUpdateMap
          (Data2D<int> *__return_storage_ptr__,GridWavelet *this,double tolerance,
          TypeRefinement criteria,int output)

{
  int iVar1;
  size_t sVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int new_num_strips;
  size_t sVar10;
  ulong uVar11;
  bool bVar12;
  int iVar13;
  ulong uVar14;
  pointer pdVar15;
  pointer pdVar16;
  long lVar17;
  size_t k;
  ulong uVar18;
  _func_int **local_330;
  Data2D<int> indexes;
  vector<double,_std::allocator<double>_> norm;
  MultiIndexSet local_2c8;
  Data2D<double> vals;
  _Vector_base<int,_std::allocator<int>_> local_278;
  SplitDirections split;
  GridWavelet direction_grid;
  
  uVar7 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  sVar10 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  split.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start._0_4_ = -(uint)(tolerance == 0.0) & 1;
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&direction_grid,sVar10 * (long)(int)uVar7,
             (value_type_conflict3 *)&split,(allocator_type *)&vals);
  local_330 = direction_grid.super_BaseCanonicalGrid._vptr_BaseCanonicalGrid;
  __return_storage_ptr__->stride = sVar10;
  __return_storage_ptr__->num_strips = (long)(int)uVar7;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)direction_grid.super_BaseCanonicalGrid._vptr_BaseCanonicalGrid;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)direction_grid.super_BaseCanonicalGrid.acceleration;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)direction_grid.super_BaseCanonicalGrid._16_8_
  ;
  direction_grid.super_BaseCanonicalGrid._vptr_BaseCanonicalGrid = (_func_int **)0x0;
  direction_grid.super_BaseCanonicalGrid.acceleration = (AccelerationContext *)0x0;
  direction_grid.super_BaseCanonicalGrid.num_dimensions = 0;
  direction_grid.super_BaseCanonicalGrid.num_outputs = 0;
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&direction_grid);
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    getNormalization(&norm,this);
    if (criteria < refine_direction_selective) {
      sVar2 = (this->coefficients).stride;
      pdVar15 = (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
      uVar14 = 0;
      uVar11 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar11 = uVar14;
      }
      pdVar16 = pdVar15;
      for (; uVar14 != uVar11; uVar14 = uVar14 + 1) {
        if (output == -1) {
          bVar12 = true;
          for (lVar17 = 0; (this->super_BaseCanonicalGrid).num_outputs != lVar17;
              lVar17 = lVar17 + 1) {
            if ((bVar12) &&
               (tolerance <
                ABS(pdVar16[lVar17]) /
                norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17])) {
              bVar12 = false;
            }
          }
          if (!bVar12) goto LAB_00184e90;
        }
        else if (tolerance <
                 ABS(pdVar15[sVar2 * uVar14 + (long)output]) /
                 norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[output]) {
LAB_00184e90:
          iVar13 = (this->super_BaseCanonicalGrid).num_dimensions;
          for (lVar17 = 0; (long)iVar13 * 4 != lVar17; lVar17 = lVar17 + 4) {
            *(undefined4 *)((long)local_330 + lVar17) = 1;
          }
        }
        pdVar16 = pdVar16 + sVar2;
        local_330 = (_func_int **)((long)local_330 + sVar10 * 4);
      }
    }
    else {
      HierarchyManipulations::SplitDirections::SplitDirections
                (&split,&(this->super_BaseCanonicalGrid).points);
      for (lVar17 = 0;
          lVar17 < (int)(((long)split.job_pnts.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)split.job_pnts.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          lVar17 = lVar17 + 1) {
        iVar13 = 1;
        if (output == -1) {
          iVar13 = (this->super_BaseCanonicalGrid).num_outputs;
        }
        piVar3 = split.job_pnts.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar17].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        uVar11 = (ulong)((long)split.job_pnts.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar17].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar3) >> 2;
        iVar1 = *(int *)(CONCAT44(split.job_directions.super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (uint)split.job_directions.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) + lVar17 * 4);
        new_num_strips = (int)uVar11;
        Data2D<double>::Data2D<int,int>(&vals,iVar13,new_num_strips);
        Data2D<int>::Data2D<int,int>
                  (&indexes,(this->super_BaseCanonicalGrid).num_dimensions,new_num_strips);
        uVar11 = uVar11 & 0xffffffff;
        if (new_num_strips < 1) {
          uVar11 = 0;
        }
        for (uVar14 = 0;
            piVar6 = indexes.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
            piVar5 = indexes.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
            piVar4 = indexes.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start, uVar11 != uVar14; uVar14 = uVar14 + 1) {
          pdVar15 = (this->super_BaseCanonicalGrid).values.values.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start +
                    (long)piVar3[uVar14] * (this->super_BaseCanonicalGrid).values.num_outputs;
          if (output == -1) {
            lVar9 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (lVar9 != 0) {
              memmove(vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + vals.stride * uVar14,pdVar15,lVar9 << 3);
            }
          }
          else {
            vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[vals.stride * uVar14] = pdVar15[output];
          }
          lVar9 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
          if (0 < lVar9) {
            memmove(indexes.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + indexes.stride * uVar14,
                    (this->super_BaseCanonicalGrid).points.indexes.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start +
                    (long)piVar3[uVar14] * (this->super_BaseCanonicalGrid).points.num_dimensions,
                    lVar9 << 2);
          }
        }
        local_2c8.num_dimensions = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
        indexes.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        indexes.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        indexes.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_2c8.cache_num_indexes =
             (int)((ulong)((long)piVar5 - (long)piVar4 >> 2) / local_2c8.num_dimensions);
        local_2c8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = piVar4;
        local_2c8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar5;
        local_2c8.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = piVar6;
        local_278._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_278._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_278._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        GridWavelet(&direction_grid,(this->super_BaseCanonicalGrid).acceleration,&local_2c8,iVar13,
                    this->order,&vals);
        ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&local_2c8.indexes.super__Vector_base<int,_std::allocator<int>_>);
        ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_278);
        sVar2 = (this->coefficients).stride;
        pdVar15 = (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar16 = direction_grid.coefficients.vec.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (uVar14 = 0; uVar14 != uVar11; uVar14 = uVar14 + 1) {
          lVar9 = sVar2 * (long)piVar3[uVar14];
          if (output == -1) {
            uVar7 = (this->super_BaseCanonicalGrid).num_outputs;
            uVar8 = (ulong)uVar7;
            if ((int)uVar7 < 1) {
              uVar8 = 0;
            }
            bVar12 = true;
            for (uVar18 = 0; uVar8 != uVar18; uVar18 = uVar18 + 1) {
              if (((bVar12) &&
                  (tolerance <
                   ABS(pdVar15[lVar9 + uVar18]) /
                   norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar18])) &&
                 (tolerance <
                  ABS(pdVar16[uVar18]) /
                  norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar18])) {
                bVar12 = false;
              }
            }
            uVar7 = (uint)(~bVar12 & 1);
          }
          else {
            uVar7 = 0;
            if ((tolerance <
                 ABS(pdVar15[lVar9 + output]) /
                 norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[output]) &&
               (tolerance <
                ABS(direction_grid.coefficients.vec.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[direction_grid.coefficients.stride * uVar14]) /
                norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[output])) {
              uVar7 = 1;
            }
          }
          *(uint *)((long)local_330 + (long)piVar3[uVar14] * sVar10 * 4 + (long)iVar1 * 4) = uVar7;
          pdVar16 = pdVar16 + direction_grid.coefficients.stride;
        }
        ~GridWavelet(&direction_grid);
        ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&indexes.vec.super__Vector_base<int,_std::allocator<int>_>);
        ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&vals.vec.super__Vector_base<double,_std::allocator<double>_>);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections(&split);
    }
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&norm.super__Vector_base<double,_std::allocator<double>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridWavelet::buildUpdateMap(double tolerance, TypeRefinement criteria, int output) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        // classic refinement
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = coefficients.getStrip(i);
            if (output == -1){
                for(size_t k=0; k<((size_t) num_outputs); k++){
                    if (small && ((std::abs(s[k]) / norm[k]) > tolerance)) small = false;
                }
            }else{
                small = !((std::abs(s[output]) / norm[output]) > tolerance);
            }
            if (!small){
                int *p = pmap.getStrip(i);
                std::fill(p, p + num_dimensions, 1);
            }
        }
    }else{
        HierarchyManipulations::SplitDirections split(points);

        for(int s=0; s<split.getNumJobs(); s++){
            int d = split.getJobDirection(s);
            int nump = split.getJobNumPoints(s);
            const int *pnts = split.getJobPoints(s);

            int active_outputs = (output == -1) ? num_outputs : 1;

            Data2D<double> vals(active_outputs, nump);
            Data2D<int> indexes(num_dimensions, nump);

            for(int i=0; i<nump; i++){
                const double* v = values.getValues(pnts[i]);
                double *vls = vals.getStrip(i);
                if (output == -1){
                    std::copy(v, v + num_outputs, vls);
                }else{
                    vls[0] = v[output];
                }
                std::copy_n(points.getIndex(pnts[i]), num_dimensions, indexes.getStrip(i));
            }

            GridWavelet direction_grid(acceleration, {(size_t) num_dimensions, indexes.release()}, active_outputs, order, std::move(vals));

            for(int i=0; i<nump; i++){
                bool small = true;
                const double *coeff = direction_grid.coefficients.getStrip(i);
                const double *soeff = coefficients.getStrip(pnts[i]);
                if (output == -1){
                    for(int k=0; k<num_outputs; k++){
                        if (small && ((std::abs(soeff[k]) / norm[k]) > tolerance) && ((std::abs(coeff[k]) / norm[k]) > tolerance)) small = false;
                    }
                }else{
                    if (((std::abs(soeff[output]) / norm[output]) > tolerance) && ((std::abs(coeff[0]) / norm[output]) > tolerance)) small = false;
                }
                pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;
            }
        }
    }
    return pmap;
}